

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

void __thiscall
cmMessenger::DisplayMessage
          (cmMessenger *this,MessageType t,string *text,cmListFileBacktrace *backtrace)

{
  bool bVar1;
  element_type *this_00;
  string local_1e0;
  cmListFileBacktrace local_1c0;
  undefined4 local_1b0;
  undefined1 local_1a0 [8];
  ostringstream msg;
  cmListFileBacktrace *backtrace_local;
  string *text_local;
  MessageType t_local;
  cmMessenger *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  bVar1 = printMessagePreamble(t,(ostream *)local_1a0);
  if (bVar1) {
    PrintBacktraceTitle(this,(ostream *)local_1a0,backtrace);
    printMessageText((ostream *)local_1a0,text);
    cmListFileBacktrace::cmListFileBacktrace(&local_1c0,backtrace);
    anon_unknown.dwarf_78e0e9::PrintCallStack((ostream *)local_1a0,&local_1c0,&this->TopSource);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1c0);
    displayMessage(t,(ostringstream *)local_1a0);
    bVar1 = std::operator!=(&this->DebuggerAdapter,(nullptr_t)0x0);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->DebuggerAdapter);
      std::__cxx11::ostringstream::str();
      cmDebugger::cmDebuggerAdapter::OnMessageOutput(this_00,t,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    local_1b0 = 0;
  }
  else {
    local_1b0 = 1;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

void cmMessenger::DisplayMessage(MessageType t, const std::string& text,
                                 const cmListFileBacktrace& backtrace) const
{
  std::ostringstream msg;
  if (!printMessagePreamble(t, msg)) {
    return;
  }

  // Add the immediate context.
  this->PrintBacktraceTitle(msg, backtrace);

  printMessageText(msg, text);

  // Add the rest of the context.
  PrintCallStack(msg, backtrace, this->TopSource);

  displayMessage(t, msg);

#ifdef CMake_ENABLE_DEBUGGER
  if (DebuggerAdapter != nullptr) {
    DebuggerAdapter->OnMessageOutput(t, msg.str());
  }
#endif
}